

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_6_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  float *pfVar26;
  int iVar27;
  int iVar28;
  float *data;
  ulong uVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int scale;
  long lVar48;
  float *pfVar49;
  int k_count;
  byte bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar83 [12];
  undefined1 in_ZMM10 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [64];
  int data_width;
  int local_f4;
  float local_c8;
  
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  fVar66 = ipoint->scale;
  auVar87 = ZEXT464((uint)fVar66);
  auVar51 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)fVar66),auVar58,0xf8);
  auVar51 = ZEXT416((uint)(fVar66 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  fVar64 = -0.08 / (fVar66 * fVar66);
  scale = (int)auVar51._0_4_;
  auVar52._0_4_ = (int)auVar51._0_4_;
  auVar52._4_4_ = (int)auVar51._4_4_;
  auVar52._8_4_ = (int)auVar51._8_4_;
  auVar52._12_4_ = (int)auVar51._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar52);
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->x),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->x + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53._0_8_ = (double)auVar52._0_4_;
  auVar53._8_8_ = auVar52._8_8_;
  auVar57._0_8_ = (double)fVar66;
  auVar57._8_8_ = 0;
  auVar52 = vfmadd231sd_fma(auVar53,auVar57,ZEXT816(0x3fe0000000000000));
  auVar56._0_4_ = (float)auVar52._0_8_;
  auVar56._4_12_ = auVar52._4_12_;
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->y),auVar58,0xf8);
  fVar5 = auVar56._0_4_ - auVar51._0_4_;
  auVar52 = ZEXT416((uint)(ipoint->y + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54._0_8_ = (double)auVar52._0_4_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar52 = vfmadd231sd_fma(auVar54,auVar57,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar52._0_8_;
  auVar55._4_12_ = auVar52._4_12_;
  fVar86 = auVar55._0_4_ - auVar51._0_4_;
  auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar66),auVar56);
  auVar52 = vpternlogd_avx512vl(auVar59,auVar51,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = ZEXT416((uint)fVar66);
  if (scale < (int)auVar51._0_4_) {
    auVar60._8_4_ = 0x3effffff;
    auVar60._0_8_ = 0x3effffff3effffff;
    auVar60._12_4_ = 0x3effffff;
    auVar61._8_4_ = 0x80000000;
    auVar61._0_8_ = 0x8000000080000000;
    auVar61._12_4_ = 0x80000000;
    auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar52,auVar55);
    auVar53 = vpternlogd_avx512vl(auVar61,auVar51,auVar60,0xea);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
    if (scale < (int)auVar51._0_4_) {
      auVar51 = vfmadd231ss_fma(auVar56,auVar52,ZEXT416(0x41300000));
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar53 = vpternlogd_avx512vl(auVar62,auVar51,auVar60,0xea);
      auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      if ((int)auVar51._0_4_ + scale <= iimage->width) {
        auVar51 = vfmadd231ss_fma(auVar55,auVar52,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar53 = vpternlogd_avx512vl(auVar60,auVar51,auVar15,0xf8);
        auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
        auVar51 = vroundss_avx(auVar51,auVar51,0xb);
        if ((int)auVar51._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar39 = iimage->data;
          iVar20 = scale * 2;
          lVar23 = 0;
          fVar5 = fVar5 + 0.5;
          iVar37 = -0xc;
          pfVar26 = haarResponseY + 5;
          pfVar49 = haarResponseX + 5;
          do {
            auVar51._0_4_ = (float)iVar37;
            auVar51._4_12_ = in_ZMM10._4_12_;
            lVar33 = 0;
            auVar51 = vfmadd213ss_fma(auVar51,auVar52,ZEXT416((uint)(fVar86 + 0.5)));
            iVar19 = (int)auVar51._0_4_;
            iVar21 = (iVar19 + -1) * iVar2;
            iVar27 = (iVar19 + -1 + scale) * iVar2;
            iVar19 = (iVar19 + -1 + iVar20) * iVar2;
            do {
              iVar35 = (int)lVar33;
              auVar73._0_4_ = (float)(iVar35 + -0xc);
              auVar83 = in_ZMM10._4_12_;
              auVar73._4_12_ = auVar83;
              auVar82._0_4_ = (float)(iVar35 + -0xb);
              auVar82._4_12_ = auVar83;
              auVar80._0_4_ = (float)(iVar35 + -10);
              auVar80._4_12_ = auVar83;
              auVar79._0_4_ = (float)(iVar35 + -9);
              auVar79._4_12_ = auVar83;
              auVar51 = vfmadd213ss_fma(auVar73,auVar52,ZEXT416((uint)fVar5));
              auVar76._0_4_ = (float)(iVar35 + -8);
              auVar76._4_12_ = auVar83;
              auVar53 = vfmadd213ss_fma(auVar82,auVar52,ZEXT416((uint)fVar5));
              auVar57 = ZEXT416((uint)fVar5);
              auVar54 = vfmadd213ss_fma(auVar80,auVar52,auVar57);
              auVar55 = vfmadd213ss_fma(auVar79,auVar52,auVar57);
              auVar56 = vfmadd213ss_fma(auVar76,auVar52,auVar57);
              iVar42 = (int)auVar51._0_4_;
              auVar74._0_4_ = (float)(iVar35 + -7);
              auVar74._4_12_ = in_ZMM9._4_12_;
              auVar51 = vfmadd213ss_fma(auVar74,auVar52,auVar57);
              iVar36 = iVar42 + -1 + scale;
              iVar28 = iVar42 + -1 + iVar20;
              fVar66 = pfVar39[iVar19 + -1 + iVar42];
              iVar47 = (int)auVar53._0_4_;
              fVar65 = pfVar39[iVar21 + iVar28];
              iVar30 = iVar47 + -1 + scale;
              iVar46 = iVar47 + -1 + iVar20;
              auVar58 = SUB6416(ZEXT464(0x40000000),0);
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar36] -
                                                      pfVar39[iVar36 + iVar19])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar28 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar42])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar42] -
                                                      pfVar39[iVar27 + iVar28])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar28 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar42])));
              pfVar49[lVar33 + -5] = (fVar66 - fVar65) + auVar53._0_4_;
              pfVar26[lVar33 + -5] = auVar57._0_4_ - (fVar66 - fVar65);
              in_ZMM10 = ZEXT464((uint)pfVar39[iVar46 + iVar19]);
              fVar66 = pfVar39[iVar19 + -1 + iVar47];
              iVar42 = (int)auVar54._0_4_;
              fVar65 = pfVar39[iVar21 + iVar46];
              iVar36 = iVar42 + -1 + scale;
              iVar28 = iVar42 + -1 + iVar20;
              auVar54 = ZEXT416((uint)(pfVar39[iVar46 + iVar19] - pfVar39[iVar21 + -1 + iVar47]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar30] -
                                                      pfVar39[iVar30 + iVar19])),auVar58,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar47] -
                                                      pfVar39[iVar27 + iVar46])),auVar58,auVar54);
              pfVar49[lVar33 + -4] = (fVar66 - fVar65) + auVar53._0_4_;
              pfVar26[lVar33 + -4] = auVar54._0_4_ - (fVar66 - fVar65);
              iVar47 = (int)auVar55._0_4_;
              fVar66 = pfVar39[iVar19 + -1 + iVar42];
              fVar65 = pfVar39[iVar21 + iVar28];
              in_ZMM9 = ZEXT464((uint)pfVar39[iVar28 + iVar19]);
              iVar30 = iVar47 + -1 + scale;
              iVar46 = iVar47 + -1 + iVar20;
              auVar54 = ZEXT416((uint)(pfVar39[iVar28 + iVar19] - pfVar39[iVar21 + -1 + iVar42]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar36] -
                                                      pfVar39[iVar36 + iVar19])),auVar58,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar42] -
                                                      pfVar39[iVar27 + iVar28])),auVar58,auVar54);
              pfVar49[lVar33 + -3] = (fVar66 - fVar65) + auVar53._0_4_;
              pfVar26[lVar33 + -3] = auVar54._0_4_ - (fVar66 - fVar65);
              iVar42 = (int)auVar56._0_4_;
              fVar66 = pfVar39[iVar19 + -1 + iVar47];
              fVar65 = pfVar39[iVar21 + iVar46];
              iVar36 = iVar42 + -1 + scale;
              iVar28 = iVar42 + -1 + iVar20;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar30] -
                                                      pfVar39[iVar30 + iVar19])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar47])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar47] -
                                                      pfVar39[iVar27 + iVar46])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar47])));
              pfVar49[lVar33 + -2] = (fVar66 - fVar65) + auVar53._0_4_;
              pfVar26[lVar33 + -2] = auVar54._0_4_ - (fVar66 - fVar65);
              iVar47 = (int)auVar51._0_4_;
              fVar66 = pfVar39[iVar19 + -1 + iVar42];
              fVar65 = pfVar39[iVar21 + iVar28];
              iVar46 = iVar47 + -1 + iVar20;
              iVar30 = iVar47 + -1 + scale;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar36] -
                                                      pfVar39[iVar36 + iVar19])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar28 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar42])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar42] -
                                                      pfVar39[iVar27 + iVar28])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar28 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar42])));
              pfVar49[lVar33 + -1] = (fVar66 - fVar65) + auVar51._0_4_;
              pfVar26[lVar33 + -1] = auVar53._0_4_ - (fVar66 - fVar65);
              fVar66 = pfVar39[iVar19 + -1 + iVar47];
              fVar65 = pfVar39[iVar21 + iVar46];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar21 + iVar30] -
                                                      pfVar39[iVar30 + iVar19])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar47])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + -1 + iVar47] -
                                                      pfVar39[iVar27 + iVar46])),auVar58,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar19] -
                                                      pfVar39[iVar21 + -1 + iVar47])));
              pfVar49[lVar33] = (fVar66 - fVar65) + auVar51._0_4_;
              pfVar26[lVar33] = auVar53._0_4_ - (fVar66 - fVar65);
              lVar33 = lVar33 + 6;
            } while (iVar35 + -0xc < 6);
            pfVar26 = pfVar26 + 0x18;
            pfVar49 = pfVar49 + 0x18;
            iVar37 = iVar37 + 1;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0x18);
          goto LAB_0019cb70;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar33 = 0;
  lVar23 = 0;
  iVar20 = -0xc;
  do {
    auVar67._0_4_ = (float)iVar20;
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar51 = vfmadd213ss_fma(auVar67,auVar87._0_16_,ZEXT416((uint)fVar86));
    fVar65 = auVar51._0_4_;
    iVar46 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar27 = iVar46 + -1;
    iVar21 = iVar2 + iVar46;
    iVar19 = iVar2 + -1 + iVar46;
    iVar35 = iVar46 + -1 + scale;
    pfVar39 = haarResponseX;
    pfVar49 = haarResponseY;
    lVar32 = lVar33;
    iVar37 = -0xc;
    do {
      auVar68._0_4_ = (float)iVar37;
      auVar68._4_12_ = in_ZMM8._4_12_;
      auVar51 = vfmadd213ss_fma(auVar68,auVar87._0_16_,ZEXT416((uint)fVar5));
      auVar78._0_4_ = (float)(iVar37 + 1);
      auVar78._4_12_ = in_ZMM8._4_12_;
      auVar53 = vfmadd213ss_fma(auVar78,auVar87._0_16_,ZEXT416((uint)fVar5));
      fVar77 = auVar53._0_4_;
      fVar65 = auVar51._0_4_;
      iVar28 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if (((iVar46 < 1) || (iVar28 < 1)) || (iimage->height < iVar21)) {
LAB_0019c36c:
        haarXY(iimage,iVar46,iVar28,scale,(float *)((long)pfVar39 + lVar32),
               (float *)((long)pfVar49 + lVar32));
        iVar47 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar47 = iimage->width;
        iVar36 = iVar2 + iVar28;
        if (iVar47 < iVar36) goto LAB_0019c36c;
        iVar45 = iVar28 + -1 + scale;
        iVar30 = iimage->data_width;
        pfVar26 = iimage->data;
        iVar42 = iVar30 * iVar27;
        iVar44 = iVar30 * iVar19;
        fVar65 = pfVar26[iVar44 + -1 + iVar28];
        fVar6 = pfVar26[iVar42 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar42 + iVar45] - pfVar26[iVar44 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar26[iVar44 + -1 + iVar36] -
                                                pfVar26[iVar42 + -1 + iVar28])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar26[iVar30 * iVar35 + -1 + iVar28] -
                                                pfVar26[iVar30 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar26[iVar44 + -1 + iVar36] -
                                                pfVar26[iVar42 + -1 + iVar28])));
        *(float *)((long)pfVar39 + lVar32) = (fVar65 - fVar6) + auVar51._0_4_;
        *(float *)((long)pfVar49 + lVar32) = auVar53._0_4_ - (fVar65 - fVar6);
      }
      pfVar26 = (float *)((long)pfVar39 + lVar32 + 4);
      pfVar1 = (float *)((long)pfVar49 + lVar32 + 4);
      iVar28 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      if (((iVar46 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar21 || (iVar36 = iVar2 + iVar28, iVar47 < iVar36)))) {
        haarXY(iimage,iVar46,iVar28,scale,pfVar26,pfVar1);
        iVar47 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar30 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar42 = iVar28 + -1 + scale;
        iVar45 = iVar30 * iVar27;
        iVar44 = iVar30 * iVar19;
        fVar65 = pfVar3[iVar44 + -1 + iVar28];
        fVar77 = pfVar3[iVar45 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar42] - pfVar3[iVar44 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar28])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar30 * iVar35 + -1 + iVar28] -
                                                pfVar3[iVar30 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar28])));
        *pfVar26 = (fVar65 - fVar77) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar65 - fVar77);
      }
      auVar51 = vpbroadcastd_avx512vl();
      auVar51 = vpaddd_avx(auVar51,_DAT_00599790);
      pfVar26 = (float *)((long)pfVar39 + lVar32 + 8);
      pfVar1 = (float *)((long)pfVar49 + lVar32 + 8);
      auVar51 = vcvtdq2ps_avx(auVar51);
      auVar17._4_4_ = fVar5;
      auVar17._0_4_ = fVar5;
      auVar17._8_4_ = fVar5;
      auVar17._12_4_ = fVar5;
      auVar18._4_4_ = fVar66;
      auVar18._0_4_ = fVar66;
      auVar18._8_4_ = fVar66;
      auVar18._12_4_ = fVar66;
      auVar53 = vfmadd132ps_fma(auVar51,auVar17,auVar18);
      auVar51 = vshufps_avx(auVar53,auVar53,0xff);
      uVar24 = vcmpps_avx512vl(auVar53,_DAT_00599190,0xd);
      bVar50 = (byte)(uVar24 >> 3);
      iVar28 = (int)((double)((ulong)(bVar50 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      if (((iVar46 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar21 || (iVar36 = iVar2 + iVar28, iVar47 < iVar36)))) {
        haarXY(iimage,iVar46,iVar28,scale,pfVar26,pfVar1);
        iVar47 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar30 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar28 + -1 + scale;
        iVar44 = iVar30 * iVar27;
        iVar42 = iVar30 * iVar19;
        fVar65 = pfVar3[iVar42 + -1 + iVar28];
        fVar77 = pfVar3[iVar44 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar45] - pfVar3[iVar42 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar30 * iVar35 + -1 + iVar28] -
                                                pfVar3[iVar30 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        *pfVar26 = (fVar65 - fVar77) + auVar51._0_4_;
        *pfVar1 = auVar54._0_4_ - (fVar65 - fVar77);
      }
      auVar51 = vpermilpd_avx(auVar53,1);
      pfVar26 = (float *)((long)pfVar39 + lVar32 + 0xc);
      pfVar1 = (float *)((long)pfVar49 + lVar32 + 0xc);
      bVar50 = (byte)uVar24;
      iVar28 = (int)((double)((ulong)(bVar50 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      if ((((iVar46 < 1) || (iVar28 < 1)) || (iimage->height < iVar21)) ||
         (iVar36 = iVar2 + iVar28, iVar47 < iVar36)) {
        haarXY(iimage,iVar46,iVar28,scale,pfVar26,pfVar1);
        iVar47 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar30 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar28 + -1 + scale;
        iVar44 = iVar30 * iVar27;
        iVar42 = iVar30 * iVar19;
        fVar65 = pfVar3[iVar42 + -1 + iVar28];
        fVar77 = pfVar3[iVar44 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar45] - pfVar3[iVar42 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar30 * iVar35 + -1 + iVar28] -
                                                pfVar3[iVar30 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        *pfVar26 = (fVar65 - fVar77) + auVar51._0_4_;
        *pfVar1 = auVar54._0_4_ - (fVar65 - fVar77);
      }
      auVar51 = vmovshdup_avx(auVar53);
      pfVar26 = (float *)((long)pfVar39 + lVar32 + 0x10);
      pfVar1 = (float *)((long)pfVar49 + lVar32 + 0x10);
      iVar28 = (int)((double)((ulong)(bVar50 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      if (((iVar46 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar21 || (iVar36 = iVar2 + iVar28, iVar47 < iVar36)))) {
        haarXY(iimage,iVar46,iVar28,scale,pfVar26,pfVar1);
        iVar47 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar30 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar28 + -1 + scale;
        iVar44 = iVar30 * iVar27;
        iVar42 = iVar30 * iVar19;
        fVar65 = pfVar3[iVar42 + -1 + iVar28];
        fVar77 = pfVar3[iVar44 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar45] - pfVar3[iVar42 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar30 * iVar35 + -1 + iVar28] -
                                                pfVar3[iVar30 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar36] -
                                                pfVar3[iVar44 + -1 + iVar28])));
        *pfVar26 = (fVar65 - fVar77) + auVar51._0_4_;
        *pfVar1 = auVar54._0_4_ - (fVar65 - fVar77);
      }
      local_c8 = auVar53._0_4_;
      pfVar26 = (float *)((long)pfVar39 + lVar32 + 0x14);
      pfVar1 = (float *)((long)pfVar49 + lVar32 + 0x14);
      iVar28 = (int)((double)((ulong)(bVar50 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar50 & 1) * -0x4020000000000000) + (double)local_c8);
      if (((iVar46 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar21 || (iVar36 = iVar2 + iVar28, iVar47 < iVar36)))) {
        haarXY(iimage,iVar46,iVar28,scale,pfVar26,pfVar1);
        pfVar39 = haarResponseX;
        pfVar49 = haarResponseY;
      }
      else {
        iVar47 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar42 = iVar28 + -1 + scale;
        iVar30 = iVar47 * iVar27;
        iVar45 = iVar47 * iVar19;
        fVar65 = pfVar3[iVar45 + -1 + iVar28];
        fVar77 = pfVar3[iVar30 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar30 + iVar42] - pfVar3[iVar45 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar30 + -1 + iVar28])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar47 * iVar35 + -1 + iVar28] -
                                                pfVar3[iVar47 * iVar35 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar30 + -1 + iVar28])));
        *pfVar26 = (fVar65 - fVar77) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar65 - fVar77);
      }
      auVar87 = ZEXT1664(auVar52);
      lVar32 = lVar32 + 0x18;
      bVar4 = iVar37 < 6;
      iVar37 = iVar37 + 6;
    } while (bVar4);
    iVar20 = iVar20 + 1;
    lVar23 = lVar23 + 1;
    lVar33 = lVar33 + 0x60;
  } while (lVar23 != 0x18);
LAB_0019cb70:
  fVar86 = auVar87._0_4_;
  auVar85._8_4_ = 0x3effffff;
  auVar85._0_8_ = 0x3effffff3effffff;
  auVar85._12_4_ = 0x3effffff;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar51 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 0.5)),auVar84,0xf8);
  auVar51 = ZEXT416((uint)(fVar86 * 0.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 1.5)),auVar84,0xf8);
  auVar52 = ZEXT416((uint)(fVar86 * 1.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 2.5)),auVar84,0xf8);
  auVar53 = ZEXT416((uint)(fVar86 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 3.5)),auVar84,0xf8);
  auVar54 = ZEXT416((uint)(fVar86 * 3.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 4.5)),auVar84,0xf8);
  auVar55 = ZEXT416((uint)(fVar86 * 4.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 5.5)),auVar84,0xf8);
  auVar56 = ZEXT416((uint)(fVar86 * 5.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 6.5)),auVar84,0xf8);
  auVar57 = ZEXT416((uint)(fVar86 * 6.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 7.5)),auVar84,0xf8);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar86 * 7.5));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 8.5)),auVar84,0xf8);
  auVar59 = ZEXT416((uint)(fVar86 * 8.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 9.5)),auVar84,0xf8);
  auVar60 = ZEXT416((uint)(fVar86 * 9.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 10.5)),auVar84,0xf8);
  auVar61 = ZEXT416((uint)(fVar86 * 10.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 11.5)),auVar84,0xf8);
  fVar70 = auVar53._0_4_;
  fVar66 = fVar70 + auVar52._0_4_;
  fVar5 = fVar70 + auVar51._0_4_;
  auVar53 = ZEXT416((uint)(fVar86 * 11.5 + auVar62._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  fVar86 = fVar70 - auVar51._0_4_;
  fVar65 = fVar70 - auVar52._0_4_;
  fVar77 = fVar70 - auVar54._0_4_;
  fVar6 = fVar70 - auVar55._0_4_;
  fVar7 = fVar70 - auVar56._0_4_;
  fVar70 = fVar70 - auVar57._0_4_;
  fVar81 = auVar58._0_4_;
  fVar8 = fVar81 - auVar54._0_4_;
  fVar9 = fVar81 - auVar55._0_4_;
  fVar10 = fVar81 - auVar56._0_4_;
  fVar11 = fVar81 - auVar57._0_4_;
  fVar12 = fVar81 - auVar59._0_4_;
  fVar13 = fVar81 - auVar60._0_4_;
  fVar14 = fVar81 - auVar61._0_4_;
  fVar81 = fVar81 - auVar53._0_4_;
  gauss_s1_c0[0] = expf(fVar66 * fVar66 * fVar64);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar64);
  gauss_s1_c0[2] = expf(fVar86 * fVar86 * fVar64);
  gauss_s1_c0[3] = expf(fVar65 * fVar65 * fVar64);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar77 * fVar77 * fVar64);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar64);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar64);
  gauss_s1_c0[8] = expf(fVar70 * fVar70 * fVar64);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar64);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar64);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar64);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar64);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar64);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar64);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar64);
  gauss_s1_c1[8] = expf(fVar81 * fVar81 * fVar64);
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  uVar24 = 0xfffffff8;
  fVar66 = 0.0;
  lVar23 = 0;
  lVar33 = 0;
  local_f4 = 0;
  do {
    pfVar39 = gauss_s1_c1;
    uVar22 = (uint)uVar24;
    if (uVar22 != 7) {
      pfVar39 = gauss_s1_c0;
    }
    lVar32 = (long)local_f4;
    lVar33 = (long)(int)lVar33;
    if (uVar22 == 0xfffffff8) {
      pfVar39 = gauss_s1_c1;
    }
    uVar43 = 0;
    local_f4 = local_f4 + 4;
    uVar38 = 0xfffffff8;
    lVar40 = (long)haarResponseX + lVar23;
    lVar31 = (long)haarResponseY + lVar23;
    do {
      pfVar49 = gauss_s1_c1;
      if (uVar38 != 7) {
        pfVar49 = gauss_s1_c0;
      }
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar38 == 0xfffffff8) {
        pfVar49 = gauss_s1_c1;
      }
      uVar25 = (ulong)(uVar38 >> 0x1c & 0xfffffff8);
      uVar29 = uVar43;
      lVar34 = lVar31;
      lVar48 = lVar40;
      do {
        lVar41 = 0;
        pfVar26 = (float *)((long)pfVar39 + (ulong)(uint)((int)(uVar24 >> 0x1f) << 5));
        do {
          fVar5 = pfVar49[uVar25] * *pfVar26;
          pfVar26 = pfVar26 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar41 * 4)),
                                  ZEXT416(*(uint *)(lVar48 + lVar41 * 4)),0x10);
          lVar41 = lVar41 + 1;
          auVar75._0_4_ = fVar5 * auVar51._0_4_;
          auVar75._4_4_ = fVar5 * auVar51._4_4_;
          auVar75._8_4_ = fVar5 * auVar51._8_4_;
          auVar75._12_4_ = fVar5 * auVar51._12_4_;
          auVar51 = vandps_avx(auVar75,auVar69);
          auVar51 = vmovlhps_avx(auVar75,auVar51);
          auVar71._0_4_ = auVar87._0_4_ + auVar51._0_4_;
          auVar71._4_4_ = auVar87._4_4_ + auVar51._4_4_;
          auVar71._8_4_ = auVar87._8_4_ + auVar51._8_4_;
          auVar71._12_4_ = auVar87._12_4_ + auVar51._12_4_;
          auVar87 = ZEXT1664(auVar71);
        } while (lVar41 != 9);
        uVar29 = uVar29 + 0x18;
        uVar25 = uVar25 + (ulong)(-1 < (int)uVar38) * 2 + -1;
        lVar48 = lVar48 + 0x60;
        lVar34 = lVar34 + 0x60;
      } while (uVar29 < uVar38 * 0x18 + 0x198);
      uVar38 = uVar38 + 5;
      uVar43 = uVar43 + 0x78;
      fVar5 = gauss_s2_arr[lVar32];
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar54 = vmulps_avx512vl(auVar71,auVar16);
      lVar32 = lVar32 + 1;
      auVar72._0_4_ = auVar54._0_4_ * auVar54._0_4_;
      auVar72._4_4_ = auVar54._4_4_ * auVar54._4_4_;
      auVar72._8_4_ = auVar54._8_4_ * auVar54._8_4_;
      auVar72._12_4_ = auVar54._12_4_ * auVar54._12_4_;
      auVar52 = vshufpd_avx(auVar54,auVar54,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar33) = auVar54;
      lVar33 = lVar33 + 4;
      lVar40 = lVar40 + 0x1e0;
      lVar31 = lVar31 + 0x1e0;
      auVar51 = vmovshdup_avx(auVar72);
      auVar53 = vfmadd231ss_fma(auVar51,auVar54,auVar54);
      auVar51 = vshufps_avx(auVar54,auVar54,0xff);
      auVar52 = vfmadd213ss_fma(auVar52,auVar52,auVar53);
      auVar51 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      fVar66 = fVar66 + auVar51._0_4_;
    } while (local_f4 != (int)lVar32);
    lVar23 = lVar23 + 0x14;
    uVar24 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar66 < 0.0) {
    fVar66 = sqrtf(fVar66);
  }
  else {
    auVar51 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
    fVar66 = auVar51._0_4_;
  }
  lVar23 = 0;
  auVar87 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar66)));
  do {
    auVar63 = vmulps_avx512f(auVar87,*(undefined1 (*) [64])(ipoint->descriptor + lVar23));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar23) = auVar63;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}